

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::TransformationParameter::ByteSizeLong(TransformationParameter *this)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  sVar5 = sVar5 + (ulong)(uint)(this->mean_value_).current_size_ * 5;
  sVar6 = sVar5;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->mean_file_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      uVar7 = this->crop_size_ | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar4 * 9 + 0x49U >> 6) + 1;
    }
    uVar8 = (ulong)((uVar1 >> 3 & 2) + (uVar1 >> 2 & 2) + (uVar1 >> 1 & 2));
    sVar6 = sVar5 + 5 + uVar8;
    if ((uVar1 & 0x20) == 0) {
      sVar6 = sVar5 + uVar8;
    }
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t TransformationParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.TransformationParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float mean_value = 5;
  {
    unsigned int count = this->mean_value_size();
    size_t data_size = 4UL * count;
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->mean_value_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional string mean_file = 4;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional uint32 crop_size = 3 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional bool mirror = 2 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool force_color = 6 [default = false];
    if (has_force_color()) {
      total_size += 1 + 1;
    }

    // optional bool force_gray = 7 [default = false];
    if (has_force_gray()) {
      total_size += 1 + 1;
    }

    // optional float scale = 1 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}